

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_manager.cpp
# Opt level: O0

bool spvtools::opt::operator==(FeatureManager *a,FeatureManager *b)

{
  bool bVar1;
  FeatureManager *b_local;
  FeatureManager *a_local;
  
  if (a->grammar_ == b->grammar_) {
    bVar1 = spvtools::operator!=(&a->capabilities_,&b->capabilities_);
    if (bVar1) {
      a_local._7_1_ = false;
    }
    else {
      bVar1 = spvtools::operator!=(&a->extensions_,&b->extensions_);
      if (bVar1) {
        a_local._7_1_ = false;
      }
      else if (a->extinst_importid_GLSLstd450_ == b->extinst_importid_GLSLstd450_) {
        if (a->extinst_importid_OpenCL100DebugInfo_ == b->extinst_importid_OpenCL100DebugInfo_) {
          if (a->extinst_importid_Shader100DebugInfo_ == b->extinst_importid_Shader100DebugInfo_) {
            a_local._7_1_ = true;
          }
          else {
            a_local._7_1_ = false;
          }
        }
        else {
          a_local._7_1_ = false;
        }
      }
      else {
        a_local._7_1_ = false;
      }
    }
  }
  else {
    a_local._7_1_ = false;
  }
  return a_local._7_1_;
}

Assistant:

bool operator==(const FeatureManager& a, const FeatureManager& b) {
  // We check that the addresses of the grammars are the same because they
  // are large objects, and this is faster.  It can be changed if needed as a
  // later time.
  if (&a.grammar_ != &b.grammar_) {
    return false;
  }

  if (a.capabilities_ != b.capabilities_) {
    return false;
  }

  if (a.extensions_ != b.extensions_) {
    return false;
  }

  if (a.extinst_importid_GLSLstd450_ != b.extinst_importid_GLSLstd450_) {
    return false;
  }

  if (a.extinst_importid_OpenCL100DebugInfo_ !=
      b.extinst_importid_OpenCL100DebugInfo_) {
    return false;
  }

  if (a.extinst_importid_Shader100DebugInfo_ !=
      b.extinst_importid_Shader100DebugInfo_) {
    return false;
  }

  return true;
}